

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

int ktx::validateMemory(char *data,size_t size,bool warningsAsErrors,bool GLTFBasisU,
                       function<void_(const_ktx::ValidationReport_&)> *callback)

{
  int iVar1;
  FatalValidationError *anon_var_0;
  ValidationContextMemory ctx;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  size_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  ValidationContextMemory *in_stack_fffffffffffffea0;
  undefined1 in_stack_ffffffffffffff8f;
  ValidationContext *in_stack_ffffffffffffff90;
  
  std::function<void_(const_ktx::ValidationReport_&)>::function
            ((function<void_(const_ktx::ValidationReport_&)> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_stack_fffffffffffffe48
            );
  ValidationContextMemory::ValidationContextMemory
            (in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f,
             (bool)in_stack_fffffffffffffe9e,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe80);
  std::function<void_(const_ktx::ValidationReport_&)>::~function
            ((function<void_(const_ktx::ValidationReport_&)> *)0x2b07a3);
  iVar1 = ValidationContext::validate(in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  ValidationContextMemory::~ValidationContextMemory((ValidationContextMemory *)0x2b07cd);
  return iVar1;
}

Assistant:

int validateMemory(const char* data, std::size_t size, bool warningsAsErrors, bool GLTFBasisU, std::function<void(const ValidationReport&)> callback) {
    try {
        ValidationContextMemory ctx{warningsAsErrors, GLTFBasisU, std::move(callback), data, size};
        return ctx.validate();
    } catch (const FatalValidationError&) {
        return +rc::INVALID_FILE;
    }
}